

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O3

void __thiscall
capnp::SchemaLoader::CompatibilityChecker::checkCompatibility
          (CompatibilityChecker *this,Reader *type,Reader *replacement,
          UpgradeToStructMode upgradeToStructMode)

{
  short sVar1;
  ushort uVar2;
  uint uVar3;
  short *psVar4;
  bool bVar5;
  uint uVar6;
  Exception *pEVar7;
  Maybe<capnp::schema::Node::Reader> *matchSize;
  uint64_t structTypeId;
  int iVar8;
  Maybe<capnp::schema::Field::Reader> *matchPosition;
  WirePointer *pWVar9;
  StructDataBitCount *pSVar10;
  Fault *this_00;
  Fault f;
  Fault f_1;
  PointerReader local_128;
  Maybe<capnp::schema::Field::Reader> local_108;
  Maybe<capnp::schema::Node::Reader> local_d0;
  Maybe<capnp::schema::Field::Reader> local_98;
  Maybe<capnp::schema::Node::Reader> local_60;
  
  this_00 = &f;
  uVar3 = (replacement->_reader).dataSize;
  if (uVar3 < 0x10) {
    if ((type->_reader).dataSize < 0x10) {
      return;
    }
    if (*(type->_reader).data == 0) {
      return;
    }
LAB_001454af:
    if ((*(type->_reader).data == 0xd) && (bVar5 = canUpgradeToData(this,replacement), bVar5))
    goto LAB_001454c8;
LAB_001454df:
    pSVar10 = &(type->_reader).dataSize;
    uVar3 = (replacement->_reader).dataSize;
    if (uVar3 < 0x10) {
      uVar6 = *pSVar10;
LAB_00145518:
      bVar5 = true;
      if (0xf < uVar6) {
LAB_0014551f:
        bVar5 = false;
        if ((0xf < uVar3) && (*(type->_reader).data == 0x12)) {
          uVar2 = *(replacement->_reader).data;
          bVar5 = false;
          if ((0xb < uVar2) && (bVar5 = false, uVar2 != 0xf)) {
LAB_001454c8:
            replacementIsOlder(this);
            return;
          }
        }
      }
      if (upgradeToStructMode == ALLOW_UPGRADE_TO_STRUCT) {
        if ((!bVar5) && (psVar4 = (short *)(type->_reader).data, *psVar4 == 0x10)) {
          if (uVar6 < 0x80) {
            structTypeId = 0;
          }
          else {
            structTypeId = *(uint64_t *)(psVar4 + 4);
          }
          matchSize = &local_60;
          local_60.ptr.isSet = false;
          matchPosition = &local_98;
          local_98.ptr.isSet = false;
LAB_001457de:
          checkUpgradeToStruct(this,replacement,structTypeId,matchSize,matchPosition);
          return;
        }
        if ((0xf < uVar3) && (psVar4 = (short *)(replacement->_reader).data, *psVar4 == 0x10)) {
          if (uVar3 < 0x80) {
            structTypeId = 0;
          }
          else {
            structTypeId = *(uint64_t *)(psVar4 + 4);
          }
          matchSize = &local_d0;
          local_d0.ptr.isSet = false;
          matchPosition = &local_108;
          local_108.ptr.isSet = false;
          replacement = type;
          goto LAB_001457de;
        }
      }
    }
    else {
      uVar6 = *pSVar10;
      if (*(replacement->_reader).data != 0x12) goto LAB_00145518;
      if (0xf < uVar6) {
        uVar2 = *(type->_reader).data;
        if ((0xb < uVar2) && (uVar2 != 0xf)) {
LAB_0014548f:
          replacementIsNewer(this);
          return;
        }
        goto LAB_0014551f;
      }
    }
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0x3cc,FAILED,(char *)0x0,"\"a type was changed\"",
               (char (*) [19])"a type was changed");
  }
  else {
    sVar1 = *(replacement->_reader).data;
    uVar6 = (type->_reader).dataSize;
    if (uVar6 < 0x10) {
      if (sVar1 == 0) {
        return;
      }
LAB_00145472:
      if (*(replacement->_reader).data == 0xd) {
        bVar5 = canUpgradeToData(this,type);
        if (bVar5) goto LAB_0014548f;
        uVar6 = (type->_reader).dataSize;
      }
      if (0xf < uVar6) goto LAB_001454af;
      goto LAB_001454df;
    }
    psVar4 = (short *)(type->_reader).data;
    if (sVar1 != *psVar4) goto LAB_00145472;
    switch(sVar1) {
    case 0xe:
      pWVar9 = (WirePointer *)0x0;
      iVar8 = 0x7fffffff;
      f_1.exception._0_4_ = 0;
      f_1.exception._4_4_ = 0;
      if ((type->_reader).pointerCount != 0) {
        f_1.exception._0_4_ = *(undefined4 *)&(type->_reader).segment;
        f_1.exception._4_4_ = *(undefined4 *)((long)&(type->_reader).segment + 4);
      }
      _::PointerReader::getStruct((StructReader *)&f,(PointerReader *)&f_1,(word *)0x0);
      bVar5 = (replacement->_reader).pointerCount != 0;
      if (bVar5) {
        pWVar9 = (replacement->_reader).pointers;
        iVar8 = (replacement->_reader).nestingLimit;
      }
      local_128.segment._0_4_ = 0;
      local_128.segment._4_4_ = 0;
      local_128.capTable._0_4_ = 0;
      local_128.capTable._4_4_ = 0;
      if (bVar5) {
        local_128.segment._0_4_ = *(undefined4 *)&(replacement->_reader).segment;
        local_128.segment._4_4_ = *(undefined4 *)((long)&(replacement->_reader).segment + 4);
        local_128.capTable._0_4_ = *(undefined4 *)&(replacement->_reader).capTable;
        local_128.capTable._4_4_ = *(undefined4 *)((long)&(replacement->_reader).capTable + 4);
      }
      local_128.pointer = pWVar9;
      local_128.nestingLimit = iVar8;
      _::PointerReader::getStruct((StructReader *)&f_1,&local_128,(word *)0x0);
      checkCompatibility(this,(Reader *)&f,(Reader *)&f_1,ALLOW_UPGRADE_TO_STRUCT);
      return;
    case 0xf:
      if (uVar3 < 0x80) {
        f.exception = (Exception *)0x0;
      }
      else {
        f.exception = *(Exception **)((long)(replacement->_reader).data + 8);
      }
      if (uVar6 < 0x80) {
        pEVar7 = (Exception *)0x0;
      }
      else {
        pEVar7 = *(Exception **)(psVar4 + 4);
      }
      if (f.exception == pEVar7) {
        return;
      }
      this_00 = &f_1;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long>&,char_const(&)[23]>
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,1000,FAILED,"replacement.getEnum().getTypeId() == type.getEnum().getTypeId()",
                 "_kjCondition,\"type changed enum type\"",
                 (DebugComparison<unsigned_long,_unsigned_long> *)&f,
                 (char (*) [23])"type changed enum type");
      break;
    case 0x10:
      if (uVar3 < 0x80) {
        f.exception = (Exception *)0x0;
      }
      else {
        f.exception = *(Exception **)((long)(replacement->_reader).data + 8);
      }
      if (uVar6 < 0x80) {
        pEVar7 = (Exception *)0x0;
      }
      else {
        pEVar7 = *(Exception **)(psVar4 + 4);
      }
      if (f.exception == pEVar7) {
        return;
      }
      this_00 = &f_1;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long>&,char_const(&)[41]>
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x3f4,FAILED,"replacement.getStruct().getTypeId() == type.getStruct().getTypeId()"
                 ,"_kjCondition,\"type changed to incompatible struct type\"",
                 (DebugComparison<unsigned_long,_unsigned_long> *)&f,
                 (char (*) [41])"type changed to incompatible struct type");
      break;
    case 0x11:
      if (uVar3 < 0x80) {
        f.exception = (Exception *)0x0;
      }
      else {
        f.exception = *(Exception **)((long)(replacement->_reader).data + 8);
      }
      if (uVar6 < 0x80) {
        pEVar7 = (Exception *)0x0;
      }
      else {
        pEVar7 = *(Exception **)(psVar4 + 4);
      }
      if (f.exception == pEVar7) {
        return;
      }
      this_00 = &f_1;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long>&,char_const(&)[44]>
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x3f9,FAILED,
                 "replacement.getInterface().getTypeId() == type.getInterface().getTypeId()",
                 "_kjCondition,\"type changed to incompatible interface type\"",
                 (DebugComparison<unsigned_long,_unsigned_long> *)&f,
                 (char (*) [44])"type changed to incompatible interface type");
      break;
    default:
      goto switchD_001453e2_default;
    }
  }
  this->compatibility = INCOMPATIBLE;
  kj::_::Debug::Fault::~Fault(this_00);
switchD_001453e2_default:
  return;
}

Assistant:

void checkCompatibility(const schema::Type::Reader& type,
                          const schema::Type::Reader& replacement,
                          UpgradeToStructMode upgradeToStructMode) {
    if (replacement.which() != type.which()) {
      // Check for allowed "upgrade" to Data or AnyPointer.
      if (replacement.isData() && canUpgradeToData(type)) {
        replacementIsNewer();
        return;
      } else if (type.isData() && canUpgradeToData(replacement)) {
        replacementIsOlder();
        return;
      } else if (replacement.isAnyPointer() && canUpgradeToAnyPointer(type)) {
        replacementIsNewer();
        return;
      } else if (type.isAnyPointer() && canUpgradeToAnyPointer(replacement)) {
        replacementIsOlder();
        return;
      }

      if (upgradeToStructMode == ALLOW_UPGRADE_TO_STRUCT) {
        if (type.isStruct()) {
          checkUpgradeToStruct(replacement, type.getStruct().getTypeId());
          return;
        } else if (replacement.isStruct()) {
          checkUpgradeToStruct(type, replacement.getStruct().getTypeId());
          return;
        }
      }

      FAIL_VALIDATE_SCHEMA("a type was changed");
    }

    switch (type.which()) {
      case schema::Type::VOID:
      case schema::Type::BOOL:
      case schema::Type::INT8:
      case schema::Type::INT16:
      case schema::Type::INT32:
      case schema::Type::INT64:
      case schema::Type::UINT8:
      case schema::Type::UINT16:
      case schema::Type::UINT32:
      case schema::Type::UINT64:
      case schema::Type::FLOAT32:
      case schema::Type::FLOAT64:
      case schema::Type::TEXT:
      case schema::Type::DATA:
      case schema::Type::ANY_POINTER:
        return;

      case schema::Type::LIST:
        checkCompatibility(type.getList().getElementType(), replacement.getList().getElementType(),
                           ALLOW_UPGRADE_TO_STRUCT);
        return;

      case schema::Type::ENUM:
        VALIDATE_SCHEMA(replacement.getEnum().getTypeId() == type.getEnum().getTypeId(),
                        "type changed enum type");
        return;

      case schema::Type::STRUCT:
        // TODO(someday):  If the IDs don't match, we should compare the two structs for
        //   compatibility.  This is tricky, though, because the new type's target may not yet be
        //   loaded.  In that case we could take the old type, make a copy of it, assign the new
        //   ID to the copy, and load() that.  That forces any struct type loaded for that ID to
        //   be compatible.  However, that has another problem, which is that it could be that the
        //   whole reason the type was replaced was to fork that type, and so an incompatibility
        //   could be very much expected.  This could be a rat hole...
        VALIDATE_SCHEMA(replacement.getStruct().getTypeId() == type.getStruct().getTypeId(),
                        "type changed to incompatible struct type");
        return;

      case schema::Type::INTERFACE:
        VALIDATE_SCHEMA(replacement.getInterface().getTypeId() == type.getInterface().getTypeId(),
                        "type changed to incompatible interface type");
        return;
    }

    // We assume unknown types (from newer versions of Cap'n Proto?) are equivalent.
  }